

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12ValidSelfIssuedinhibitAnyPolicyTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section12ValidSelfIssuedinhibitAnyPolicyTest9
          (Section12ValidSelfIssuedinhibitAnyPolicyTest9<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12ValidSelfIssuedinhibitAnyPolicyTest9) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitAnyPolicy1CACert",
                               "inhibitAnyPolicy1SelfIssuedCACert",
                               "inhibitAnyPolicy1subCA2Cert",
                               "inhibitAnyPolicy1SelfIssuedsubCA2Cert",
                               "ValidSelfIssuedinhibitAnyPolicyTest9EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy1CACRL",
                              "inhibitAnyPolicy1subCA2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.9";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}